

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O3

void skewness_double_suite::test_left_skew(void)

{
  size_type sVar1;
  long lVar2;
  value_type diff;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  close_to<double> predicate;
  close_to<double> predicate_00;
  close_to<double> predicate_01;
  close_to<double> predicate_02;
  close_to<double> predicate_03;
  close_to<double> predicate_04;
  close_to<double> predicate_05;
  close_to<double> predicate_06;
  close_to<double> predicate_07;
  close_to<double> predicate_08;
  close_to<double> predicate_09;
  close_to<double> predicate_10;
  value_type local_60;
  double local_58;
  undefined1 local_50 [24];
  anon_struct_8_1_6167ffdf_for_sum aStack_38;
  
  local_50._8_8_ = 1;
  local_50._0_8_ = 1.0;
  stack0xffffffffffffffc0 = ZEXT816(0);
  local_60 = 1.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","1.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d5,"void skewness_double_suite::test_left_skew()",&local_60,
             &stack0xffffffffffffff98);
  local_60 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.variance()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d6,"void skewness_double_suite::test_left_skew()",&local_60,
             &stack0xffffffffffffff98);
  local_60 = 0.0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d7,"void skewness_double_suite::test_left_skew()",&local_60,
             &stack0xffffffffffffff98);
  local_60 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
             unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_50);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.unbiased_skewness()","0.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,0x1d8,"void skewness_double_suite::test_left_skew()",&local_60,
             &stack0xffffffffffffff98);
  dVar3 = 2.0 - (double)local_50._0_8_;
  sVar1 = local_50._8_8_ + 1;
  auVar5._8_4_ = (int)(sVar1 >> 0x20);
  auVar5._0_8_ = sVar1;
  auVar5._12_4_ = 0x45300000;
  dVar4 = dVar3 / ((auVar5._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  auVar11._8_4_ = SUB84(local_50._8_8_,4);
  auVar11._0_8_ = local_50._8_8_;
  auVar11._12_4_ = 0x45300000;
  lVar2 = local_50._8_8_ - 1;
  auVar8._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar8._0_8_ = lVar2;
  auVar8._12_4_ = 0x45300000;
  local_60 = (double)local_50._0_8_ + dVar4;
  dVar4 = dVar4 * ((double)local_50._16_8_ * -3.0 +
                  ((auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
                  ((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0)) *
                  dVar3 * dVar4) + aStack_38.skewness;
  unique0x10000af7 = SUB84(dVar4,0);
  local_50._16_8_ = (2.0 - local_60) * dVar3 + (double)local_50._16_8_;
  unique0x10000afb = (int)((ulong)dVar4 >> 0x20);
  predicate.absolute = 2.2250738585072014e-308;
  predicate.relative = 1e-05;
  local_50._0_8_ = local_60;
  local_50._8_8_ = sVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","1.5","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1da,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3ff8000000000000,predicate);
  local_60 = (double)local_50._16_8_ /
             (((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
  predicate_00.absolute = 2.2250738585072014e-308;
  predicate_00.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","0.25","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1db,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3fd0000000000000,predicate_00);
  dVar4 = 0.0;
  if (2.220446049250313e-16 <= aStack_38.skewness) {
    dVar4 = aStack_38.skewness *
            SQRT(((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
    if ((double)local_50._16_8_ < 0.0) {
      local_58 = dVar4;
      dVar3 = sqrt((double)local_50._16_8_);
      dVar4 = local_58;
    }
    else {
      dVar3 = SQRT((double)local_50._16_8_);
    }
    dVar4 = dVar4 / (dVar3 * (double)local_50._16_8_);
  }
  predicate_01.absolute = 2.2250738585072014e-308;
  predicate_01.relative = 1e-05;
  local_60 = dVar4;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1dc,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x0,predicate_01);
  local_60 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
             unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_50);
  predicate_02.absolute = 2.2250738585072014e-308;
  predicate_02.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","0.0","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1dd,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x0,predicate_02);
  dVar3 = 5.0 - (double)local_50._0_8_;
  sVar1 = local_50._8_8_ + 1;
  auVar6._8_4_ = (int)(sVar1 >> 0x20);
  auVar6._0_8_ = sVar1;
  auVar6._12_4_ = 0x45300000;
  dVar4 = dVar3 / ((auVar6._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  auVar12._8_4_ = SUB84(local_50._8_8_,4);
  auVar12._0_8_ = local_50._8_8_;
  auVar12._12_4_ = 0x45300000;
  lVar2 = local_50._8_8_ - 1;
  auVar9._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar9._0_8_ = lVar2;
  auVar9._12_4_ = 0x45300000;
  local_60 = (double)local_50._0_8_ + dVar4;
  dVar4 = dVar4 * ((double)local_50._16_8_ * -3.0 +
                  ((auVar9._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
                  ((auVar12._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0)) *
                  dVar3 * dVar4) + aStack_38.skewness;
  unique0x10000b1b = SUB84(dVar4,0);
  local_50._16_8_ = (5.0 - local_60) * dVar3 + (double)local_50._16_8_;
  unique0x10000b1f = (int)((ulong)dVar4 >> 0x20);
  predicate_03.absolute = 2.2250738585072014e-308;
  predicate_03.relative = 1e-05;
  local_50._0_8_ = local_60;
  local_50._8_8_ = sVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","2.66667","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1df,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x4005555714b9cb68,predicate_03);
  local_60 = (double)local_50._16_8_ /
             (((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
  predicate_04.absolute = 2.2250738585072014e-308;
  predicate_04.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","2.88889","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e0,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x40071c725c3dee78,predicate_04);
  dVar4 = 0.0;
  if (2.220446049250313e-16 <= aStack_38.skewness) {
    dVar4 = aStack_38.skewness *
            SQRT(((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
    if ((double)local_50._16_8_ < 0.0) {
      local_58 = dVar4;
      dVar3 = sqrt((double)local_50._16_8_);
      dVar4 = local_58;
    }
    else {
      dVar3 = SQRT((double)local_50._16_8_);
    }
    dVar4 = dVar4 / (dVar3 * (double)local_50._16_8_);
  }
  predicate_05.absolute = 2.2250738585072014e-308;
  predicate_05.relative = 1e-05;
  local_60 = dVar4;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.52800","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e1,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3fe0e5604189374c,predicate_05);
  local_60 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
             unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_50);
  predicate_06.absolute = 2.2250738585072014e-308;
  predicate_06.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","1.29334","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e2,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3ff4b18548a9bcfd,predicate_06);
  dVar3 = 15.0 - (double)local_50._0_8_;
  sVar1 = local_50._8_8_ + 1;
  auVar7._8_4_ = (int)(sVar1 >> 0x20);
  auVar7._0_8_ = sVar1;
  auVar7._12_4_ = 0x45300000;
  dVar4 = dVar3 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
  auVar13._8_4_ = SUB84(local_50._8_8_,4);
  auVar13._0_8_ = local_50._8_8_;
  auVar13._12_4_ = 0x45300000;
  lVar2 = local_50._8_8_ - 1;
  auVar10._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar10._0_8_ = lVar2;
  auVar10._12_4_ = 0x45300000;
  local_60 = (double)local_50._0_8_ + dVar4;
  dVar4 = dVar4 * ((double)local_50._16_8_ * -3.0 +
                  ((auVar10._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) *
                  ((auVar13._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0)) *
                  dVar3 * dVar4) + aStack_38.skewness;
  unique0x10000b3f = SUB84(dVar4,0);
  local_50._16_8_ = (15.0 - local_60) * dVar3 + (double)local_50._16_8_;
  unique0x10000b43 = (int)((ulong)dVar4 >> 0x20);
  predicate_07.absolute = 2.2250738585072014e-308;
  predicate_07.relative = 1e-05;
  local_50._0_8_ = local_60;
  local_50._8_8_ = sVar1;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.mean()","5.75","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e4,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x4017000000000000,predicate_07);
  local_60 = (double)local_50._16_8_ /
             (((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
  predicate_08.absolute = 2.2250738585072014e-308;
  predicate_08.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.variance()","30.6875","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e5,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x403eb00000000000,predicate_08);
  dVar4 = 0.0;
  if (2.220446049250313e-16 <= aStack_38.skewness) {
    dVar4 = aStack_38.skewness *
            SQRT(((double)CONCAT44(0x45300000,SUB84(local_50._8_8_,4)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)local_50._8_8_) - 4503599627370496.0));
    if ((double)local_50._16_8_ < 0.0) {
      local_58 = dVar4;
      dVar3 = sqrt((double)local_50._16_8_);
      dVar4 = local_58;
    }
    else {
      dVar3 = SQRT((double)local_50._16_8_);
    }
    dVar4 = dVar4 / (dVar3 * (double)local_50._16_8_);
  }
  predicate_09.absolute = 2.2250738585072014e-308;
  predicate_09.relative = 1e-05;
  local_60 = dVar4;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.skewness()","0.92814","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e6,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3fedb352a8438088,predicate_09);
  local_60 = trial::online::cumulative::basic_moment<double,_(trial::online::with)3>::
             unbiased_skewness((basic_moment<double,_(trial::online::with)3> *)local_50);
  predicate_10.absolute = 2.2250738585072014e-308;
  predicate_10.relative = 1e-05;
  trial::online::detail::test_with_impl<double,trial::online::detail::close_to>
            ((detail *)"filter.unbiased_skewness()","1.60758","tolerance",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/cumulative/moment_suite.cpp"
             ,(char *)0x1e7,0x10f74b,(char *)&local_60,(double *)&stack0xffffffffffffff98,
             (double *)0x3ff9b8a5ce5b4246,predicate_10);
  return;
}

Assistant:

void test_left_skew()
{
    const auto tolerance = detail::close_to<double>(1e-5);
    cumulative::moment_skewness<double> filter;
    filter.push(1.0);
    TRIAL_TEST_EQ(filter.mean(), 1.0);
    TRIAL_TEST_EQ(filter.variance(), 0.0);
    TRIAL_TEST_EQ(filter.skewness(), 0.0);
    TRIAL_TEST_EQ(filter.unbiased_skewness(), 0.0);
    filter.push(2.0);
    TRIAL_TEST_WITH(filter.mean(), 1.5, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 0.25, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.0, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 0.0, tolerance);
    filter.push(5.0);
    TRIAL_TEST_WITH(filter.mean(), 2.66667, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 2.88889, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.52800, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 1.29334, tolerance);
    filter.push(15.0);
    TRIAL_TEST_WITH(filter.mean(), 5.75, tolerance);
    TRIAL_TEST_WITH(filter.variance(), 30.6875, tolerance);
    TRIAL_TEST_WITH(filter.skewness(), 0.92814, tolerance);
    TRIAL_TEST_WITH(filter.unbiased_skewness(), 1.60758, tolerance);
}